

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::HasPackageReferences(cmGeneratorTarget *this)

{
  bool bVar1;
  string *psVar2;
  bool bVar3;
  string local_48;
  
  bVar1 = IsInBuildSystem(this);
  if (bVar1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"VS_PACKAGE_REFERENCES","");
    psVar2 = (string *)GetProperty(this,&local_48);
    if (psVar2 == (string *)0x0) {
      psVar2 = &cmValue::Empty_abi_cxx11_;
    }
    bVar3 = psVar2->_M_string_length != 0;
  }
  else {
    bVar3 = false;
  }
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmGeneratorTarget::HasPackageReferences() const
{
  return this->IsInBuildSystem() &&
    !this->GetProperty("VS_PACKAGE_REFERENCES")->empty();
}